

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void __thiscall Imf_3_4::Header::~Header(Header *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 9) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 9) + 8))();
    }
  }
  anon_unknown_1::clearCompressionRecord(this);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
               *)this);
  return;
}

Assistant:

Header::~Header ()
{
    for (AttributeMap::iterator i = _map.begin (); i != _map.end (); ++i)
    {
        delete i->second;
    }
    clearCompressionRecord (this);
}